

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O2

bool __thiscall testing::internal::UnitTestImpl::RunAllTests(UnitTestImpl *this)

{
  InternalRunDeathTestFlag *pIVar1;
  TestEventRepeater *pTVar2;
  pointer ppEVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  TimeInMillis TVar9;
  TimeInMillis TVar10;
  TestCase *this_00;
  __normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>
  __tmp;
  pointer ppEVar11;
  byte bVar12;
  int i;
  uint uVar13;
  int test_index;
  
  if (g_init_gtest_count == 0) {
    puts(
        "\nThis test program did NOT call ::testing::InitGoogleTest before calling RUN_ALL_TESTS().  Please fix it."
        );
    bVar5 = false;
  }
  else {
    bVar5 = true;
    if (g_help_flag == '\0') {
      PostFlagParsingInit(this);
      WriteToShardStatusFileIfNeeded();
      pIVar1 = (this->internal_run_death_test_flag_).ptr_;
      bVar4 = ShouldShard("GTEST_TOTAL_SHARDS","GTEST_SHARD_INDEX",
                          pIVar1 != (InternalRunDeathTestFlag *)0x0);
      iVar6 = FilterTests(this,(uint)!bVar4);
      if (FLAGS_gtest_list_tests == '\x01') {
        ListTestsMatchingFilter(this);
      }
      else {
        iVar7 = 0;
        if (FLAGS_gtest_shuffle == '\x01') {
          iVar7 = GetRandomSeedFromFlag(FLAGS_gtest_random_seed);
        }
        this->random_seed_ = iVar7;
        pTVar2 = (this->listeners_).repeater_;
        TVar9 = GetTimeInMillis();
        this->start_timestamp_ = TVar9;
        (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[2])(pTVar2,this->parent_);
        uVar8 = FLAGS_gtest_repeat;
        if (pIVar1 != (InternalRunDeathTestFlag *)0x0) {
          uVar8 = 1;
        }
        bVar12 = 0;
        for (uVar13 = 0; uVar13 != uVar8 || (int)uVar8 < 0; uVar13 = uVar13 + 1) {
          ClearNonAdHocTestResult(this);
          TVar9 = GetTimeInMillis();
          if (iVar6 < 1) {
            (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[3])
                      (pTVar2,this->parent_,(ulong)uVar13);
          }
          else {
            if (FLAGS_gtest_shuffle == '\x01') {
              (this->random_).state_ = this->random_seed_;
              ShuffleTests(this);
            }
            (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[3])
                      (pTVar2,this->parent_,(ulong)uVar13);
            (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[4])(pTVar2,this->parent_);
            ForEach<std::vector<testing::Environment*,std::allocator<testing::Environment*>>,void(*)(testing::Environment*)>
                      (&this->environments_,SetUpEnvironment);
            (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[5])(pTVar2,this->parent_);
            bVar5 = Test::HasFatalFailure();
            if (!bVar5) {
              for (iVar7 = 0;
                  iVar7 < (int)((ulong)((long)(this->test_cases_).
                                              super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(this->test_cases_).
                                             super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
                  iVar7 = iVar7 + 1) {
                this_00 = GetMutableTestCase(this,iVar7);
                TestCase::Run(this_00);
              }
            }
            (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xb])(pTVar2,this->parent_);
            ppEVar3 = (this->environments_).
                      super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            for (ppEVar11 = (this->environments_).
                            super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish; ppEVar11 != ppEVar3;
                ppEVar11 = ppEVar11 + -1) {
              (**(code **)(*(long *)ppEVar11[-1] + 0x18))();
            }
            (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xc])(pTVar2,this->parent_);
          }
          TVar10 = GetTimeInMillis();
          this->elapsed_time_ = TVar10 - TVar9;
          (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xd])
                    (pTVar2,this->parent_,(ulong)uVar13);
          bVar5 = Passed(this);
          UnshuffleTests(this);
          if (FLAGS_gtest_shuffle == '\x01') {
            iVar7 = GetNextRandomSeed(this->random_seed_);
            this->random_seed_ = iVar7;
          }
          bVar12 = bVar12 | !bVar5;
        }
        (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xe])(pTVar2,this->parent_);
        bVar5 = (bool)(bVar12 ^ 1);
      }
    }
  }
  return bVar5;
}

Assistant:

static bool GTestIsInitialized() { return g_init_gtest_count != 0; }